

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::AppendCatch(BinaryReaderIR *this,Catch *catch_)

{
  bool bVar1;
  Result result;
  TryExpr *pTVar2;
  reference pvVar3;
  TryExpr *try_;
  LabelNode *local_28;
  LabelNode *label;
  Catch *catch__local;
  BinaryReaderIR *this_local;
  
  local_28 = (LabelNode *)0x0;
  label = (LabelNode *)catch_;
  catch__local = (Catch *)this;
  result = TopLabel(this,&local_28);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if (local_28->label_type == Try) {
    pTVar2 = cast<wabt::TryExpr,wabt::Expr>(local_28->context);
    bVar1 = Catch::IsCatchAll((Catch *)label);
    if ((bVar1) &&
       (bVar1 = std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::empty(&pTVar2->catches),
       !bVar1)) {
      pvVar3 = std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::back(&pTVar2->catches);
      bVar1 = Catch::IsCatchAll(pvVar3);
      if (bVar1) {
        PrintError(this,"only one catch_all allowed in try block");
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    if (pTVar2->kind == Plain) {
      pTVar2->kind = Catch;
    }
    else if (pTVar2->kind != Catch) {
      PrintError(this,"catch not allowed in try-delegate");
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::push_back
              (&pTVar2->catches,(value_type *)label);
    pvVar3 = std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::back(&pTVar2->catches);
    local_28->exprs = &pvVar3->exprs;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    PrintError(this,"catch not inside try block");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::AppendCatch(Catch&& catch_) {
  LabelNode* label = nullptr;
  CHECK_RESULT(TopLabel(&label));

  if (label->label_type != LabelType::Try) {
    PrintError("catch not inside try block");
    return Result::Error;
  }

  auto* try_ = cast<TryExpr>(label->context);

  if (catch_.IsCatchAll() && !try_->catches.empty() &&
      try_->catches.back().IsCatchAll()) {
    PrintError("only one catch_all allowed in try block");
    return Result::Error;
  }

  if (try_->kind == TryKind::Plain) {
    try_->kind = TryKind::Catch;
  } else if (try_->kind != TryKind::Catch) {
    PrintError("catch not allowed in try-delegate");
    return Result::Error;
  }

  try_->catches.push_back(std::move(catch_));
  label->exprs = &try_->catches.back().exprs;
  return Result::Ok;
}